

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O1

h__Writer * __thiscall AS_02::PCM::MXFWriter::h__Writer::Finalize(h__Writer *this)

{
  long lVar1;
  long in_RSI;
  undefined1 auStack_e8 [208];
  
  if (*(int *)(in_RSI + 0x370) == 3) {
    *(undefined4 *)(in_RSI + 0x370) = 4;
    Kumu::Result_t::Result_t((Result_t *)(auStack_e8 + 0x68),(Result_t *)Kumu::RESULT_OK);
    Kumu::Result_t::~Result_t((Result_t *)(auStack_e8 + 0x68));
    h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>::FinalizeClip
              (&this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>,(ui32_t)in_RSI);
    if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      *(uint *)(in_RSI + 0x598) = *(uint *)(in_RSI + 0x338);
      lVar1 = *(long *)(in_RSI + 0x5c0);
      *(ulong *)(lVar1 + 0xf8) = (ulong)*(uint *)(in_RSI + 0x338);
      *(undefined1 *)(lVar1 + 0x100) = 1;
      h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>::WriteAS02Footer
                ((h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR> *)auStack_e8);
      Kumu::Result_t::~Result_t((Result_t *)auStack_e8);
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::Finalize()
{
  if ( ! m_State.Test_RUNNING() )
    return RESULT_STATE;

  m_State.Goto_FINAL();

  Result_t result = FinalizeClip(AS_02::MXF::CalcSampleSize(*m_WaveAudioDescriptor));

  if ( KM_SUCCESS(result) )
    {
      m_WaveAudioDescriptor->ContainerDuration = m_IndexWriter.m_Duration = m_FramesWritten;
      WriteAS02Footer();
    }

  return result;
}